

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float __thiscall
tcu::ConstPixelBufferAccess::sample1DCompare
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float ref,float s,
          IVec2 *offset)

{
  WrapMode mode;
  float c;
  int size;
  Vec4 local_50;
  float local_40;
  byte local_39;
  float u;
  bool isFixedPointDepth;
  IVec2 *offset_local;
  float local_28;
  float s_local;
  float ref_local;
  FilterMode filter_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *this_local;
  
  _u = offset;
  offset_local._4_4_ = s;
  local_28 = ref;
  s_local = (float)filter;
  _ref_local = sampler;
  sampler_local = (Sampler *)this;
  local_39 = isFixedPointDepthTextureFormat(&this->m_format);
  c = offset_local._4_4_;
  local_40 = offset_local._4_4_;
  if ((_ref_local->normalizedCoords & 1U) != 0) {
    mode = _ref_local->wrapS;
    size = Vector<int,_3>::x(&this->m_size);
    local_40 = unnormalize(mode,c,size);
  }
  if (s_local == 0.0) {
    sampleNearest1D((tcu *)&local_50,this,_ref_local,local_40,_u);
    this_local._4_4_ =
         execCompare(&local_50,_ref_local->compare,_ref_local->compareChannel,local_28,
                     (bool)(local_39 & 1));
  }
  else if (s_local == 1.4013e-45) {
    this_local._4_4_ =
         sampleLinear1DCompare(this,_ref_local,local_28,local_40,_u,(bool)(local_39 & 1));
  }
  else {
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

float ConstPixelBufferAccess::sample1DCompare (const Sampler& sampler, Sampler::FilterMode filter, float ref, float s, const IVec2& offset) const
{
	// check selected layer exists
	// \note offset.x is X offset, offset.y is the selected layer
	DE_ASSERT(de::inBounds(offset.y(), 0, m_size.y()));

	// Format information for comparison function
	const bool isFixedPointDepth = isFixedPointDepthTextureFormat(m_format);

	// Non-normalized coordinates.
	float u = s;

	if (sampler.normalizedCoords)
		u = unnormalize(sampler.wrapS, s, m_size.x());

	switch (filter)
	{
		case Sampler::NEAREST:	return execCompare(sampleNearest1D(*this, sampler, u, offset), sampler.compare, sampler.compareChannel, ref, isFixedPointDepth);
		case Sampler::LINEAR:	return sampleLinear1DCompare(*this, sampler, ref, u, offset, isFixedPointDepth);
		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}